

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

char * bson_iter_regex(bson_iter_t *iter,char **options)

{
  uint8_t *local_28;
  char *ret_options;
  char *ret;
  char **options_local;
  bson_iter_t *iter_local;
  
  ret_options = (char *)0x0;
  local_28 = (uint8_t *)0x0;
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x4ce,"bson_iter_regex","iter");
    abort();
  }
  if (iter->raw[iter->type] == '\v') {
    ret_options = (char *)(iter->raw + iter->d1);
    local_28 = iter->raw + iter->d2;
  }
  if (options != (char **)0x0) {
    *options = (char *)local_28;
  }
  return ret_options;
}

Assistant:

const char *
bson_iter_regex (const bson_iter_t *iter, /* IN */
                 const char **options)    /* IN */
{
   const char *ret = NULL;
   const char *ret_options = NULL;

   BSON_ASSERT (iter);

   if (ITER_TYPE (iter) == BSON_TYPE_REGEX) {
      ret = (const char *) (iter->raw + iter->d1);
      ret_options = (const char *) (iter->raw + iter->d2);
   }

   if (options) {
      *options = ret_options;
   }

   return ret;
}